

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

ScaleParameter *
google::protobuf::internal::DynamicCastToGenerated<caffe::ScaleParameter_const>(Message *from)

{
  ScaleParameter *pSVar1;
  
  if (from != (Message *)0x0) {
    pSVar1 = (ScaleParameter *)
             __dynamic_cast(from,&Message::typeinfo,&caffe::ScaleParameter::typeinfo,0);
    return pSVar1;
  }
  return (ScaleParameter *)0x0;
}

Assistant:

T* DynamicCastToGenerated(const Message* from) {
  // Compile-time assert that T is a generated type that has a
  // default_instance() accessor, but avoid actually calling it.
  const T&(*get_default_instance)() = &T::default_instance;
  (void)get_default_instance;

  // Compile-time assert that T is a subclass of google::protobuf::Message.
  const Message* unused = static_cast<T*>(NULL);
  (void)unused;

#if defined(GOOGLE_PROTOBUF_NO_RTTI) || \
  (defined(_MSC_VER) && !defined(_CPPRTTI))
  bool ok = &T::default_instance() ==
            from->GetReflection()->GetMessageFactory()->GetPrototype(
                from->GetDescriptor());
  return ok ? down_cast<T*>(from) : NULL;
#else
  return dynamic_cast<T*>(from);
#endif
}